

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O1

TPZStructMatrix * __thiscall
TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
::Clone(TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
        *this)

{
  long lVar1;
  _Rep_type *p_Var2;
  DecomposeType DVar3;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xe8);
  *(undefined ***)this_00 = &PTR__TPZSavable_019f2318;
  lVar1 = *(long *)(*(long *)&(this->super_TPZStructMatrixT<std::complex<double>_>).
                              super_TPZStructMatrix + -0x60);
  this_00[1].fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       (TPZStrMatParInterface-in-TPZFrontStructMatrix<TPZFrontSym<std::complex<double>>,std::complex<double>,TPZStructMatrixTBBFlow<std::complex<double>>>
        ::construction_vtable + 0x88);
  *(undefined8 *)this_00 = 0x19f2278;
  *(undefined4 *)&this_00[1].fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(undefined4 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1);
  *(undefined1 *)
   ((long)&this_00[1].fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 4) =
       *(undefined1 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019f1ad8,(TPZStructMatrix *)this);
  *(undefined8 *)this_00 = 0x19f1bb0;
  this_00[1].fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       (TPZStructMatrixT<std::complex<double>>-in-TPZFrontStructMatrix<TPZFrontSym<std::complex<double>>,std::complex<double>,TPZStructMatrixTBBFlow<std::complex<double>>>
        ::construction_vtable + 0x148);
  TPZStructMatrixTBBFlow<std::complex<double>_>::TPZStructMatrixTBBFlow
            ((TPZStructMatrixTBBFlow<std::complex<double>_> *)&this_00->field_0xa0,
             &PTR_construction_vtable_104__019f1b00,
             (TPZStructMatrixTBBFlow<std::complex<double>_> *)
             &(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.field_0xa0
            );
  *(undefined8 *)this_00 = 0x19f1888;
  this_00[1].fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       (TPZFrontStructMatrix<TPZFrontSym<std::complex<double>>,std::complex<double>,TPZStructMatrixTBBFlow<std::complex<double>>>
        ::vtable + 0x238);
  *(undefined8 *)&this_00->field_0xa0 = 0x19f1960;
  TPZVec<int>::TPZVec((TPZVec<int> *)(this_00 + 1),&this->fElementOrder);
  DVar3 = this->fDecomposeType;
  p_Var2 = &this_00[1].fMaterialIds._M_t;
  (p_Var2->_M_impl).super__Rb_tree_header._M_header._M_color = this->f_quiet;
  *(DecomposeType *)&(p_Var2->_M_impl).super__Rb_tree_header._M_header.field_0x4 = DVar3;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZFrontStructMatrix<TFront,TVar,TPar>::Clone(){
	
	auto* result =  new TPZFrontStructMatrix<TFront,TVar,TPar>(*this);
	return result;
}